

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O0

X509_NAME_ENTRY *
X509_NAME_ENTRY_create_by_txt(X509_NAME_ENTRY **ne,char *field,int type,uchar *bytes,int len)

{
  ASN1_OBJECT *obj_00;
  X509_NAME_ENTRY *nentry;
  ASN1_OBJECT *obj;
  ossl_ssize_t len_local;
  uchar *bytes_local;
  int type_local;
  char *field_local;
  X509_NAME_ENTRY **ne_local;
  
  obj_00 = OBJ_txt2obj(field,0);
  if (obj_00 == (ASN1_OBJECT *)0x0) {
    ERR_put_error(0xb,0,0x6f,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509name.cc"
                  ,0x10b);
    ERR_add_error_data(2,"name=",field);
    ne_local = (X509_NAME_ENTRY **)0x0;
  }
  else {
    ne_local = (X509_NAME_ENTRY **)X509_NAME_ENTRY_create_by_OBJ(ne,obj_00,type,bytes,len);
    ASN1_OBJECT_free(obj_00);
  }
  return (X509_NAME_ENTRY *)ne_local;
}

Assistant:

X509_NAME_ENTRY *X509_NAME_ENTRY_create_by_txt(X509_NAME_ENTRY **ne,
                                               const char *field, int type,
                                               const unsigned char *bytes,
                                               ossl_ssize_t len) {
  ASN1_OBJECT *obj;
  X509_NAME_ENTRY *nentry;

  obj = OBJ_txt2obj(field, 0);
  if (obj == NULL) {
    OPENSSL_PUT_ERROR(X509, X509_R_INVALID_FIELD_NAME);
    ERR_add_error_data(2, "name=", field);
    return NULL;
  }
  nentry = X509_NAME_ENTRY_create_by_OBJ(ne, obj, type, bytes, len);
  ASN1_OBJECT_free(obj);
  return nentry;
}